

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

bool_t ecpIsOnA(word *a,ec_o *ec,void *stack)

{
  word *b;
  word *pwVar1;
  size_t n;
  int iVar2;
  uint uVar3;
  
  n = ec->f->n;
  iVar2 = wwCmp(a,ec->f->mod,n);
  uVar3 = 0;
  if (iVar2 < 0) {
    iVar2 = wwCmp(a + n,ec->f->mod,ec->f->n);
    if (iVar2 < 0) {
      b = (word *)((long)stack + n * 8);
      pwVar1 = b + n;
      (*ec->f->sqr)((word *)stack,a,ec->f,pwVar1);
      zzAddMod((word *)stack,(word *)stack,ec->A,ec->f->mod,ec->f->n);
      (*ec->f->mul)((word *)stack,(word *)stack,a,ec->f,pwVar1);
      zzAddMod((word *)stack,(word *)stack,ec->B,ec->f->mod,ec->f->n);
      (*ec->f->sqr)(b,a + n,ec->f,pwVar1);
      iVar2 = wwCmp((word *)stack,b,ec->f->n);
      uVar3 = (uint)(iVar2 == 0);
    }
  }
  return uVar3;
}

Assistant:

bool_t ecpIsOnA(const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// pre
	ASSERT(ecIsOperable(ec));
	// xa, ya \in ec->f?
	if (!zmIsIn(ecX(a), ec->f) || !zmIsIn(ecY(a, n), ec->f))
		return FALSE;
	// t1 <- (xa^2 + A)xa + B
	qrSqr(t1, ecX(a), ec->f, stack);
	zmAdd(t1, t1, ec->A, ec->f);
	qrMul(t1, t1, ecX(a), ec->f, stack);
	zmAdd(t1, t1, ec->B, ec->f);
	// t2 <- ya^2
	qrSqr(t2, ecY(a, n), ec->f, stack);
	// t1 == t2?
	return qrCmp(t1, t2, ec->f) == 0;
}